

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::HttpHeaderId> * __thiscall
kj::HttpHeaderTable::stringToId
          (Maybe<kj::HttpHeaderId> *__return_storage_ptr__,HttpHeaderTable *this,StringPtr name)

{
  uint uVar1;
  _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  long lVar2;
  __node_ptr p_Var3;
  ulong __c;
  key_type local_20;
  
  local_20.content.size_ = name.content.size_;
  local_20.content.ptr = name.content.ptr;
  this_00 = (_Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(this->idsByName).ptr;
  if (local_20.content.ptr + (local_20.content.size_ - 1) == local_20.content.ptr) {
    __c = 0x1505;
  }
  else {
    __c = 0x1505;
    lVar2 = 0;
    do {
      __c = (ulong)((byte)local_20.content.ptr[lVar2] & 0xffffffdf) ^ __c * 0x21;
      lVar2 = lVar2 + 1;
    } while (local_20.content.size_ - 1 != lVar2);
  }
  p_Var3 = std::
           _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(this_00,__c % this_00->_M_bucket_count,&local_20,__c);
  if (p_Var3 == (__node_ptr)0x0) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    uVar1 = *(uint *)((long)&(p_Var3->
                             super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>
                             ._M_storage._M_storage + 0x10);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.table = this;
    (__return_storage_ptr__->ptr).field_1.value.id = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaderId> HttpHeaderTable::stringToId(kj::StringPtr name) const {
  auto iter = idsByName->map.find(name);
  if (iter == idsByName->map.end()) {
    return kj::none;
  } else {
    return HttpHeaderId(this, iter->second);
  }
}